

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

bool __thiscall
glslang::HlslParseContext::constructorError
          (HlslParseContext *this,TSourceLoc *loc,TIntermNode *node,TFunction *function,TOperator op
          ,TType *type)

{
  TVector<glslang::TArraySize> *pTVar1;
  pointer pTVar2;
  pointer pTVar3;
  char cVar4;
  byte bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar13;
  undefined4 extraout_var_05;
  TArraySizes *this_00;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TSmallArrayVector *this_01;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  TTypeList *pTVar14;
  byte bVar15;
  int arg;
  ulong uVar16;
  byte bVar17;
  HlslParseContext *this_02;
  bool bVar18;
  char *pcVar19;
  undefined4 extraout_var_06;
  
  iVar9 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  TType::shallowCopy(type,(TType *)CONCAT44(extraout_var,iVar9));
  if ((op - EOpConstructDMat2x2 < 0x24) || (op - EOpConstructMat2x2 < 9)) {
    bVar7 = true;
  }
  else {
    if (op == EOpConstructTextureSampler) {
      pcVar19 = "unhandled texture constructor";
      goto LAB_00395d61;
    }
    bVar7 = false;
  }
  bVar18 = true;
  iVar9 = 0;
  bVar6 = false;
  bVar15 = 0;
  bVar8 = false;
  uVar16 = 0;
  bVar17 = 0;
  while( true ) {
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (iVar10 <= (int)uVar16) break;
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar16);
    cVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var_00,iVar10) + 8) + 0xe8))();
    if (cVar4 != '\0') {
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar16);
      cVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var_01,iVar10) + 8) + 0xf8))();
      bVar8 = true;
      if (cVar4 != '\0') {
        pcVar19 = "array argument must be sized";
        goto LAB_00395d61;
      }
    }
    if (bVar7) {
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar16);
      bVar5 = (**(code **)(**(long **)(CONCAT44(extraout_var_02,iVar10) + 8) + 0xe0))();
      bVar15 = bVar15 | bVar5;
    }
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,uVar16);
    iVar10 = TType::computeNumComponents(*(TType **)(CONCAT44(extraout_var_03,iVar10) + 8));
    iVar9 = iVar9 + iVar10;
    bVar5 = bVar17;
    if ((op != EOpConstructStruct) && (iVar10 = (*type->_vptr_TType[0x1d])(), (char)iVar10 == '\0'))
    {
      iVar10 = TType::computeNumComponents(type);
      bVar5 = iVar10 <= iVar9 | bVar17;
    }
    bVar6 = (bool)(bVar6 | bVar17);
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function);
    lVar13 = (**(code **)(**(long **)(CONCAT44(extraout_var_04,iVar10) + 8) + 0x50))();
    bVar18 = (bool)(bVar18 & (*(uint *)(lVar13 + 8) & 0x7f) == 2);
    uVar16 = (ulong)((int)uVar16 + 1);
    bVar17 = bVar5;
  }
  if (bVar18) {
    iVar10 = (*type->_vptr_TType[10])(type);
    *(ulong *)(CONCAT44(extraout_var_05,iVar10) + 8) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar10) + 8) & 0xffffffffffffff80 | 2;
  }
  iVar10 = (*type->_vptr_TType[0x1d])(type);
  if ((char)iVar10 != '\0') {
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (iVar10 == 0) {
      pcVar19 = "array constructor must have at least one argument";
      goto LAB_00395d61;
    }
    iVar10 = (*type->_vptr_TType[0x1f])(type);
    if ((char)iVar10 == '\0') {
      iVar10 = (*type->_vptr_TType[0xf])(type);
      iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if ((iVar10 != iVar12) && (iVar10 = TType::computeNumComponents(type), iVar9 < iVar10)) {
        pcVar19 = "array constructor needs one argument per array element";
        goto LAB_00395d61;
      }
    }
    else {
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      TType::changeOuterArraySize(type,iVar10);
    }
    bVar7 = TType::isArrayOfArrays(type);
    if (bVar7) {
      iVar10 = (*type->_vptr_TType[0x14])(type);
      this_00 = (TArraySizes *)CONCAT44(extraout_var_06,iVar10);
      iVar12 = 0;
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
      cVar4 = (**(code **)(**(long **)(CONCAT44(extraout_var_07,iVar10) + 8) + 0xe8))();
      pcVar19 = "array constructor argument not correct type to construct array element";
      if (cVar4 == '\0') goto LAB_00395d61;
      pTVar1 = (this_00->sizes).sizes;
      if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
        iVar12 = (int)((ulong)((long)(pTVar1->
                                     super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ).
                                     super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pTVar1->
                                    super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ).
                                    super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4);
      }
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
      lVar13 = (**(code **)(**(long **)(CONCAT44(extraout_var_08,iVar10) + 8) + 0xa0))();
      lVar13 = *(long *)(lVar13 + 8);
      if (lVar13 == 0) {
        iVar10 = 1;
      }
      else {
        iVar10 = (int)((ulong)(*(long *)(lVar13 + 0x10) - *(long *)(lVar13 + 8)) >> 4) + 1;
      }
      if (iVar12 != iVar10) goto LAB_00395d61;
      bVar7 = TArraySizes::isInnerUnsized(this_00);
      if (bVar7) {
        iVar10 = 1;
        while( true ) {
          pTVar1 = (this_00->sizes).sizes;
          iVar12 = 0;
          if (pTVar1 != (TVector<glslang::TArraySize> *)0x0) {
            iVar12 = (int)((ulong)((long)(pTVar1->
                                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ).
                                         super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pTVar1->
                                        super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ).
                                        super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4);
          }
          if (iVar12 <= iVar10) break;
          uVar11 = TSmallArrayVector::getDimSize((TSmallArrayVector *)this_00,iVar10);
          if (uVar11 == 0) {
            iVar12 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
            this_01 = (TSmallArrayVector *)
                      (**(code **)(**(long **)(CONCAT44(extraout_var_09,iVar12) + 8) + 0xa0))();
            uVar11 = TSmallArrayVector::getDimSize(this_01,iVar10 + -1);
            TSmallArrayVector::setDimSize((TSmallArrayVector *)this_00,iVar10,uVar11);
          }
          iVar10 = iVar10 + 1;
        }
      }
    }
  }
  if (bVar8) {
    iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if ((op == EOpConstructStruct) || (iVar10 != 1)) {
      if (op == EOpConstructStruct) {
        bVar7 = false;
        goto LAB_00395ce3;
      }
    }
    else {
      iVar10 = (*type->_vptr_TType[0x1d])(type);
      if (((char)iVar10 != '\0') && (bVar7 = TType::isArrayOfArrays(type), !bVar7)) {
        iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
        bVar7 = TType::isArrayOfArrays(*(TType **)(CONCAT44(extraout_var_10,iVar10) + 8));
        if ((!bVar7) && (iVar10 = (*type->_vptr_TType[0xc])(type), 0 < iVar10)) {
          iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
          iVar10 = (**(code **)(**(long **)(CONCAT44(extraout_var_11,iVar10) + 8) + 0x60))();
          if (0 < iVar10) {
            return false;
          }
        }
      }
    }
    bVar8 = TType::isArrayOfArrays(type);
    bVar7 = true;
    if (!bVar8) {
      pcVar19 = "constructing non-array constituent from array argument";
      goto LAB_00395d61;
    }
  }
  else {
    bVar7 = op != EOpConstructStruct;
  }
LAB_00395ce3:
  if (((bVar15 & 1) != 0) && (iVar10 = (*type->_vptr_TType[0x1d])(type), (char)iVar10 == '\0')) {
    return false;
  }
  if (bVar6) {
    pcVar19 = "too many arguments";
  }
  else {
    if ((op == EOpConstructStruct) &&
       (this_02 = (HlslParseContext *)type, iVar10 = (*type->_vptr_TType[0x1d])(),
       (char)iVar10 == '\0')) {
      bVar8 = isScalarConstructor(this_02,node);
      if (bVar8) {
        return false;
      }
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (iVar10 == 1) {
        iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,0);
        bVar8 = TType::operator==(type,*(TType **)(CONCAT44(extraout_var_12,iVar10) + 8));
        if (bVar8) {
          return false;
        }
      }
      pTVar14 = TType::getStruct(type);
      pTVar2 = (pTVar14->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pTVar3 = (pTVar14->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar10 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
      if (iVar10 != (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 5)) {
        pcVar19 = "Number of constructor parameters does not match the number of structure fields";
        goto LAB_00395d61;
      }
    }
    if ((!(bool)(bVar7 & iVar9 != 1)) ||
       (iVar10 = TType::computeNumComponents(type), iVar10 <= iVar9)) {
      if (op != EOpConstructStruct) {
        return false;
      }
      iVar10 = TType::computeNumComponents(type);
      if (iVar10 <= iVar9) {
        return false;
      }
    }
    pcVar19 = "not enough data provided for construction";
  }
LAB_00395d61:
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
            (this,loc,pcVar19,"constructor","");
  return true;
}

Assistant:

bool HlslParseContext::constructorError(const TSourceLoc& loc, TIntermNode* node, TFunction& function,
                                        TOperator op, TType& type)
{
    type.shallowCopy(function.getType());

    bool constructingMatrix = false;
    switch (op) {
    case EOpConstructTextureSampler:
        error(loc, "unhandled texture constructor", "constructor", "");
        return true;
    case EOpConstructMat2x2:
    case EOpConstructMat2x3:
    case EOpConstructMat2x4:
    case EOpConstructMat3x2:
    case EOpConstructMat3x3:
    case EOpConstructMat3x4:
    case EOpConstructMat4x2:
    case EOpConstructMat4x3:
    case EOpConstructMat4x4:
    case EOpConstructDMat2x2:
    case EOpConstructDMat2x3:
    case EOpConstructDMat2x4:
    case EOpConstructDMat3x2:
    case EOpConstructDMat3x3:
    case EOpConstructDMat3x4:
    case EOpConstructDMat4x2:
    case EOpConstructDMat4x3:
    case EOpConstructDMat4x4:
    case EOpConstructIMat2x2:
    case EOpConstructIMat2x3:
    case EOpConstructIMat2x4:
    case EOpConstructIMat3x2:
    case EOpConstructIMat3x3:
    case EOpConstructIMat3x4:
    case EOpConstructIMat4x2:
    case EOpConstructIMat4x3:
    case EOpConstructIMat4x4:
    case EOpConstructUMat2x2:
    case EOpConstructUMat2x3:
    case EOpConstructUMat2x4:
    case EOpConstructUMat3x2:
    case EOpConstructUMat3x3:
    case EOpConstructUMat3x4:
    case EOpConstructUMat4x2:
    case EOpConstructUMat4x3:
    case EOpConstructUMat4x4:
    case EOpConstructBMat2x2:
    case EOpConstructBMat2x3:
    case EOpConstructBMat2x4:
    case EOpConstructBMat3x2:
    case EOpConstructBMat3x3:
    case EOpConstructBMat3x4:
    case EOpConstructBMat4x2:
    case EOpConstructBMat4x3:
    case EOpConstructBMat4x4:
        constructingMatrix = true;
        break;
    default:
        break;
    }

    //
    // Walk the arguments for first-pass checks and collection of information.
    //

    int size = 0;
    bool constType = true;
    bool full = false;
    bool overFull = false;
    bool matrixInMatrix = false;
    bool arrayArg = false;
    for (int arg = 0; arg < function.getParamCount(); ++arg) {
        if (function[arg].type->isArray()) {
            if (function[arg].type->isUnsizedArray()) {
                // Can't construct from an unsized array.
                error(loc, "array argument must be sized", "constructor", "");
                return true;
            }
            arrayArg = true;
        }
        if (constructingMatrix && function[arg].type->isMatrix())
            matrixInMatrix = true;

        // 'full' will go to true when enough args have been seen.  If we loop
        // again, there is an extra argument.
        if (full) {
            // For vectors and matrices, it's okay to have too many components
            // available, but not okay to have unused arguments.
            overFull = true;
        }

        size += function[arg].type->computeNumComponents();
        if (op != EOpConstructStruct && ! type.isArray() && size >= type.computeNumComponents())
            full = true;

        if (function[arg].type->getQualifier().storage != EvqConst)
            constType = false;
    }

    if (constType)
        type.getQualifier().storage = EvqConst;

    if (type.isArray()) {
        if (function.getParamCount() == 0) {
            error(loc, "array constructor must have at least one argument", "constructor", "");
            return true;
        }

        if (type.isUnsizedArray()) {
            // auto adapt the constructor type to the number of arguments
            type.changeOuterArraySize(function.getParamCount());
        } else if (type.getOuterArraySize() != function.getParamCount() && type.computeNumComponents() > size) {
            error(loc, "array constructor needs one argument per array element", "constructor", "");
            return true;
        }

        if (type.isArrayOfArrays()) {
            // Types have to match, but we're still making the type.
            // Finish making the type, and the comparison is done later
            // when checking for conversion.
            TArraySizes& arraySizes = *type.getArraySizes();

            // At least the dimensionalities have to match.
            if (! function[0].type->isArray() ||
                arraySizes.getNumDims() != function[0].type->getArraySizes()->getNumDims() + 1) {
                error(loc, "array constructor argument not correct type to construct array element", "constructor", "");
                return true;
            }

            if (arraySizes.isInnerUnsized()) {
                // "Arrays of arrays ..., and the size for any dimension is optional"
                // That means we need to adopt (from the first argument) the other array sizes into the type.
                for (int d = 1; d < arraySizes.getNumDims(); ++d) {
                    if (arraySizes.getDimSize(d) == UnsizedArraySize) {
                        arraySizes.setDimSize(d, function[0].type->getArraySizes()->getDimSize(d - 1));
                    }
                }
            }
        }
    }

    // Some array -> array type casts are okay
    if (arrayArg && function.getParamCount() == 1 && op != EOpConstructStruct && type.isArray() &&
        !type.isArrayOfArrays() && !function[0].type->isArrayOfArrays() &&
        type.getVectorSize() >= 1 && function[0].type->getVectorSize() >= 1)
        return false;

    if (arrayArg && op != EOpConstructStruct && ! type.isArrayOfArrays()) {
        error(loc, "constructing non-array constituent from array argument", "constructor", "");
        return true;
    }

    if (matrixInMatrix && ! type.isArray()) {
        return false;
    }

    if (overFull) {
        error(loc, "too many arguments", "constructor", "");
        return true;
    }

    if (op == EOpConstructStruct && ! type.isArray()) {
        if (isScalarConstructor(node))
            return false;

        // Self-type construction: e.g, we can construct a struct from a single identically typed object.
        if (function.getParamCount() == 1 && type == *function[0].type)
            return false;

        if ((int)type.getStruct()->size() != function.getParamCount()) {
            error(loc, "Number of constructor parameters does not match the number of structure fields", "constructor", "");
            return true;
        }
    }

    if ((op != EOpConstructStruct && size != 1 && size < type.computeNumComponents()) ||
        (op == EOpConstructStruct && size < type.computeNumComponents())) {
        error(loc, "not enough data provided for construction", "constructor", "");
        return true;
    }

    return false;
}